

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall
ON_3dVector::PerpendicularTo(ON_3dVector *this,ON_3dPoint *P0,ON_3dPoint *P1,ON_3dPoint *P2)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double e2;
  double e1;
  double e0;
  double s2;
  double s1;
  double s0;
  ON_3dVector N2;
  ON_3dVector N1;
  ON_3dVector N0;
  ON_3dVector V2;
  ON_3dVector V1;
  ON_3dVector V0;
  ON_3dPoint *P2_local;
  ON_3dPoint *P1_local;
  ON_3dPoint *P0_local;
  ON_3dVector *this_local;
  
  this->x = ZeroVector.x;
  this->y = ZeroVector.y;
  this->z = ZeroVector.z;
  ON_3dPoint::operator-((ON_3dVector *)&V1.z,P2,P1);
  ON_3dPoint::operator-((ON_3dVector *)&V2.z,P0,P2);
  ON_3dPoint::operator-((ON_3dVector *)&N0.z,P1,P0);
  ON_CrossProduct((ON_3dVector *)&N1.z,(ON_3dVector *)&V2.z,(ON_3dVector *)&N0.z);
  bVar1 = Unitize((ON_3dVector *)&N1.z);
  if (bVar1) {
    ON_CrossProduct((ON_3dVector *)&N2.z,(ON_3dVector *)&N0.z,(ON_3dVector *)&V1.z);
    bVar1 = Unitize((ON_3dVector *)&N2.z);
    if (bVar1) {
      ON_CrossProduct((ON_3dVector *)&s0,(ON_3dVector *)&V1.z,(ON_3dVector *)&V2.z);
      bVar1 = Unitize((ON_3dVector *)&s0);
      if (bVar1) {
        dVar2 = Length((ON_3dVector *)&V1.z);
        dVar2 = 1.0 / dVar2;
        dVar3 = Length((ON_3dVector *)&V2.z);
        dVar3 = 1.0 / dVar3;
        dVar4 = Length((ON_3dVector *)&N0.z);
        dVar4 = 1.0 / dVar4;
        dVar5 = ON_DotProduct((ON_3dVector *)&N1.z,(ON_3dVector *)&V1.z);
        dVar6 = ON_DotProduct((ON_3dVector *)&N1.z,(ON_3dVector *)&V2.z);
        dVar7 = ON_DotProduct((ON_3dVector *)&N1.z,(ON_3dVector *)&N0.z);
        dVar5 = dVar4 * ABS(dVar7) + dVar2 * ABS(dVar5) + dVar3 * ABS(dVar6);
        dVar6 = ON_DotProduct((ON_3dVector *)&N2.z,(ON_3dVector *)&V1.z);
        dVar7 = ON_DotProduct((ON_3dVector *)&N2.z,(ON_3dVector *)&V2.z);
        dVar8 = ON_DotProduct((ON_3dVector *)&N2.z,(ON_3dVector *)&N0.z);
        dVar6 = dVar4 * ABS(dVar8) + dVar2 * ABS(dVar6) + dVar3 * ABS(dVar7);
        dVar7 = ON_DotProduct((ON_3dVector *)&s0,(ON_3dVector *)&V1.z);
        dVar8 = ON_DotProduct((ON_3dVector *)&s0,(ON_3dVector *)&V2.z);
        dVar9 = ON_DotProduct((ON_3dVector *)&s0,(ON_3dVector *)&N0.z);
        dVar2 = dVar4 * ABS(dVar9) + dVar2 * ABS(dVar7) + dVar3 * ABS(dVar8);
        if (dVar6 < dVar5) {
          if (dVar2 < dVar6) {
            this->x = s0;
            this->y = N2.x;
            this->z = N2.y;
          }
          else {
            this->x = N2.z;
            this->y = N1.x;
            this->z = N1.y;
          }
        }
        else if (dVar2 < dVar5) {
          this->x = s0;
          this->y = N2.x;
          this->z = N2.y;
        }
        else {
          this->x = N1.z;
          this->y = N0.x;
          this->z = N0.y;
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_3dVector::PerpendicularTo( 
      const ON_3dPoint& P0, const ON_3dPoint& P1, const ON_3dPoint& P2
      )
{
  // Find a the unit normal to a triangle defined by 3 points
  *this = ON_3dVector::ZeroVector;

  ON_3dVector V0 = P2 - P1;
  ON_3dVector V1 = P0 - P2;
  ON_3dVector V2 = P1 - P0;

  ON_3dVector N0 = ON_CrossProduct( V1, V2 );
  if ( !N0.Unitize() )
    return false;
  ON_3dVector N1 = ON_CrossProduct( V2, V0 );
  if ( !N1.Unitize() )
    return false;
  ON_3dVector N2 = ON_CrossProduct( V0, V1 );
  if ( !N2.Unitize() )
    return false;

  const double s0 = 1.0/V0.Length();
  const double s1 = 1.0/V1.Length();
  const double s2 = 1.0/V2.Length();

  // choose normal with smallest total error
  const double e0 = s0*fabs(ON_DotProduct(N0,V0)) + s1*fabs(ON_DotProduct(N0,V1)) + s2*fabs(ON_DotProduct(N0,V2));
  const double e1 = s0*fabs(ON_DotProduct(N1,V0)) + s1*fabs(ON_DotProduct(N1,V1)) + s2*fabs(ON_DotProduct(N1,V2));
  const double e2 = s0*fabs(ON_DotProduct(N2,V0)) + s1*fabs(ON_DotProduct(N2,V1)) + s2*fabs(ON_DotProduct(N2,V2));

  if ( e0 <= e1 ) {
    if ( e0 <= e2 ) {
      *this = N0;
    }
    else {
      *this = N2;
    }
  }
  else if (e1 <= e2) {
    *this = N1;
  }
  else {
    *this = N2;
  }
  
  return true;
}